

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::printDictionaryHelp(Args *this)

{
  ostream *poVar1;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "\nThe following arguments for the dictionary are optional:\n");
  poVar1 = std::operator<<(poVar1,"  -minCount           minimal number of word occurences [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x90));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -minCountLabel      minimal number of label occurences [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x94));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -wordNgrams         max length of word ngram [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x9c));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -bucket             number of buckets [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xa8));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -minn               min length of char ngram [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xac));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -maxn               max length of char ngram [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xb0));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -t                  sampling threshold [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0xb8));
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -label              labels prefix [");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0xc0));
  std::operator<<(poVar1,"]\n");
  return;
}

Assistant:

void Args::printDictionaryHelp() {
  std::cerr << "\nThe following arguments for the dictionary are optional:\n"
            << "  -minCount           minimal number of word occurences ["
            << minCount << "]\n"
            << "  -minCountLabel      minimal number of label occurences ["
            << minCountLabel << "]\n"
            << "  -wordNgrams         max length of word ngram [" << wordNgrams
            << "]\n"
            << "  -bucket             number of buckets [" << bucket << "]\n"
            << "  -minn               min length of char ngram [" << minn
            << "]\n"
            << "  -maxn               max length of char ngram [" << maxn
            << "]\n"
            << "  -t                  sampling threshold [" << t << "]\n"
            << "  -label              labels prefix [" << label << "]\n";
}